

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_ToInt64SatFree(JSContext *ctx,int64_t *pres,JSValue val)

{
  JSValueUnion JVar1;
  uint uVar2;
  int64_t iVar3;
  int iVar4;
  double d;
  
  iVar4 = -1;
  iVar3 = 0;
  while( true ) {
    JVar1 = val.u;
    uVar2 = (uint)val.tag;
    if (uVar2 < 4) {
      iVar3 = (int64_t)val.u._0_4_;
      iVar4 = 0;
      goto LAB_0011d84f;
    }
    if (uVar2 == 6) goto LAB_0011d84f;
    if (uVar2 == 7) break;
    val = JS_ToNumberFree(ctx,val);
    if ((int)val.tag == 6) {
LAB_0011d84f:
      *pres = iVar3;
      return iVar4;
    }
  }
  iVar4 = 0;
  if (NAN(JVar1.float64)) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0x7fffffffffffffff;
    if (-9.223372036854776e+18 <= JVar1.float64) {
      if (JVar1.float64 <= 9.223372036854776e+18) {
        iVar3 = (int64_t)JVar1.float64;
      }
    }
    else {
      iVar3 = -0x8000000000000000;
    }
  }
  goto LAB_0011d84f;
}

Assistant:

static int JS_ToInt64SatFree(JSContext *ctx, int64_t *pres, JSValue val)
{
    uint32_t tag;

 redo:
    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
    case JS_TAG_INT:
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
    case JS_TAG_UNDEFINED:
        *pres = JS_VALUE_GET_INT(val);
        return 0;
    case JS_TAG_EXCEPTION:
        *pres = 0;
        return -1;
    case JS_TAG_FLOAT64:
        {
            double d = JS_VALUE_GET_FLOAT64(val);
            if (isnan(d)) {
                *pres = 0;
            } else {
                if (d < INT64_MIN)
                    *pres = INT64_MIN;
                else if (d > INT64_MAX)
                    *pres = INT64_MAX;
                else
                    *pres = (int64_t)d;
            }
        }
        return 0;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
        {
            JSBigFloat *p = JS_VALUE_GET_PTR(val);
            bf_get_int64(pres, &p->num, 0);
            JS_FreeValue(ctx, val);
        }
        return 0;
#endif
    default:
        val = JS_ToNumberFree(ctx, val);
        if (JS_IsException(val)) {
            *pres = 0;
            return -1;
        }
        goto redo;
    }
}